

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satClause.h
# Opt level: O2

void Sat_MemRestart(Sat_Mem_t *p)

{
  int **ppiVar1;
  
  p->nEntries[0] = 0;
  p->nEntries[1] = 0;
  p->iPage[0] = 0;
  p->iPage[1] = 1;
  ppiVar1 = p->pPages;
  **ppiVar1 = 2;
  *ppiVar1[1] = 2;
  return;
}

Assistant:

static inline void Sat_MemRestart( Sat_Mem_t * p )
{
    p->nEntries[0]  = 0;
    p->nEntries[1]  = 0;
    p->iPage[0]     = 0;
    p->iPage[1]     = 1;
    Sat_MemWriteLimit( p->pPages[0], 2 );
    Sat_MemWriteLimit( p->pPages[1], 2 );
}